

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  char *__s;
  cmState *this;
  bool chained_00;
  char *local_120;
  char *local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  void *local_38;
  cmMakefile *mf;
  char *pcStack_28;
  int chained_local;
  char *longDocs_local;
  char *briefDocs_local;
  char *name_local;
  void *arg_local;
  
  local_38 = arg;
  mf._4_4_ = chained;
  pcStack_28 = longDocs;
  longDocs_local = briefDocs;
  briefDocs_local = name;
  name_local = (char *)arg;
  this = cmMakefile::GetState((cmMakefile *)arg);
  __s = briefDocs_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  if (longDocs_local == (char *)0x0) {
    local_108 = "";
  }
  else {
    local_108 = longDocs_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_108,&local_91);
  if (pcStack_28 == (char *)0x0) {
    local_120 = "";
  }
  else {
    local_120 = pcStack_28;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,local_120,&local_b9);
  chained_00 = mf._4_4_ != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  cmState::DefineProperty(this,&local_58,SOURCE_FILE,&local_90,&local_b8,chained_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

static void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                           const char* briefDocs,
                                           const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE,
                                 briefDocs ? briefDocs : "",
                                 longDocs ? longDocs : "", chained != 0);
}